

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O1

GCproto * lj_bcread(LexState *ls)

{
  char **pp;
  lua_State *L;
  TValue *pTVar1;
  uint64_t uVar2;
  uint32_t uVar3;
  size_t lenx;
  GCstr *pGVar4;
  GCproto *pGVar5;
  char *pcVar6;
  lua_State *plVar7;
  
  L = ls->L;
  ls->lastline = *(int *)&L->top - (int)(L->stack).ptr64;
  (ls->sb).w = (ls->sb).b;
  pp = &ls->p;
  if ((uint)(*(int *)&ls->pe - *(int *)&ls->p) < 0xd) {
    bcread_fill(ls,0xd,0);
  }
  pcVar6 = *pp;
  *pp = pcVar6 + 1;
  if (((*pcVar6 == 'L') && (*pp = pcVar6 + 2, pcVar6[1] == 'J')) &&
     (*pp = pcVar6 + 3, pcVar6[2] == '\x02')) {
    uVar3 = lj_buf_ruleb128(pp);
    ls->level = uVar3;
    if ((uVar3 & 0xfffffff8) == 8) {
      if (((uVar3 & 4) != 0) && (plVar7 = ls->L, *(long *)((plVar7->glref).ptr64 + 0x180) == 0)) {
        pTVar1 = plVar7->top;
        uVar2 = (plVar7->stack).ptr64;
        luaopen_ffi(plVar7);
        plVar7->top = (TValue *)((long)pTVar1 + ((plVar7->stack).ptr64 - uVar2));
      }
      if ((uVar3 & 2) == 0) {
        uVar3 = lj_buf_ruleb128(pp);
        if ((uint)(*(int *)&ls->pe - *(int *)&ls->p) < uVar3) {
          bcread_fill(ls,uVar3,1);
        }
        plVar7 = ls->L;
        pcVar6 = ls->p;
        lenx = (size_t)uVar3;
        ls->p = pcVar6 + lenx;
      }
      else {
        plVar7 = ls->L;
        pcVar6 = ls->chunkarg;
        lenx = strlen(pcVar6);
      }
      pGVar4 = lj_str_new(plVar7,pcVar6,lenx);
      ls->chunkname = pGVar4;
      while( true ) {
        pcVar6 = ls->p;
        if ((pcVar6 < ls->pe) && (*pcVar6 == '\0')) break;
        if ((uint)((int)ls->pe - (int)pcVar6) < 5) {
          bcread_fill(ls,5,0);
        }
        uVar3 = lj_buf_ruleb128(pp);
        if (uVar3 == 0) goto LAB_00141427;
        if ((uint)(*(int *)&ls->pe - *(int *)&ls->p) < uVar3) {
          bcread_fill(ls,uVar3,1);
        }
        pcVar6 = ls->p;
        pGVar5 = lj_bcread_proto(ls);
        if (ls->p != pcVar6 + uVar3) goto LAB_001414a0;
        L->top->u64 = (ulong)pGVar5 | 0xfffc000000000000;
        pTVar1 = L->top;
        L->top = pTVar1 + 1;
        if ((TValue *)(L->maxstack).ptr64 <= pTVar1 + 1) {
          lj_state_growstack1(L);
        }
      }
      *pp = pcVar6 + 1;
LAB_00141427:
      if (((ls->pe == ls->p) || (ls->endmark != 0)) &&
         (L->top + -1 == (TValue *)((long)ls->lastline + (L->stack).ptr64))) {
        pTVar1 = L->top;
        L->top = pTVar1 + -1;
        return (GCproto *)(pTVar1[-1].u64 & 0x7fffffffffff);
      }
LAB_001414a0:
      bcread_error(ls,LJ_ERR_BCBAD);
    }
  }
  bcread_error(ls,LJ_ERR_BCFMT);
}

Assistant:

GCproto *lj_bcread(LexState *ls)
{
  lua_State *L = ls->L;
  lj_assertLS(ls->c == BCDUMP_HEAD1, "bad bytecode header");
  bcread_savetop(L, ls, L->top);
  lj_buf_reset(&ls->sb);
  /* Check for a valid bytecode dump header. */
  if (!bcread_header(ls))
    bcread_error(ls, LJ_ERR_BCFMT);
  for (;;) {  /* Process all prototypes in the bytecode dump. */
    GCproto *pt;
    MSize len;
    const char *startp;
    /* Read length. */
    if (ls->p < ls->pe && ls->p[0] == 0) {  /* Shortcut EOF. */
      ls->p++;
      break;
    }
    bcread_want(ls, 5);
    len = bcread_uleb128(ls);
    if (!len) break;  /* EOF */
    bcread_need(ls, len);
    startp = ls->p;
    pt = lj_bcread_proto(ls);
    if (ls->p != startp + len)
      bcread_error(ls, LJ_ERR_BCBAD);
    setprotoV(L, L->top, pt);
    incr_top(L);
  }
  if ((ls->pe != ls->p && !ls->endmark) || L->top-1 != bcread_oldtop(L, ls))
    bcread_error(ls, LJ_ERR_BCBAD);
  /* Pop off last prototype. */
  L->top--;
  return protoV(L->top);
}